

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O3

void rngClose(void)

{
  mtMtxLock(_mtx);
  _ctr = _ctr - 1;
  if (_ctr == 0) {
    blobClose(_state);
    _state = (rng_state_st *)0x0;
  }
  mtMtxUnlock(_mtx);
  return;
}

Assistant:

void rngClose()
{
	ASSERT(_inited);
	mtMtxLock(_mtx);
	ASSERT(rngIsValid_internal());
	if (--_ctr == 0)
		blobClose(_state), _state = 0;
	mtMtxUnlock(_mtx);
}